

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

void uiFree(Windows *win)

{
  if (_stdscr != 0) {
    if (win->header != (WINDOW *)0x0) {
      delwin();
    }
    if (win->body != (WINDOW *)0x0) {
      delwin();
    }
    if (win->footer != (WINDOW *)0x0) {
      delwin();
    }
    if (win->menu != (WINDOW *)0x0) {
      delwin();
    }
    endwin();
    return;
  }
  return;
}

Assistant:

void uiFree(struct Windows *win) {
    if (stdscr) {
        if (win->header) delwin(win->header);
        if (win->body) delwin(win->body);
        if (win->footer) delwin(win->footer);
        if (win->menu) delwin(win->menu);
        endwin();
    }
}